

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O2

ssize_t __thiscall
zmq::stream_engine_base_t::read(stream_engine_base_t *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 extraout_var;
  int *piVar3;
  undefined4 in_register_00000034;
  ssize_t sVar2;
  
  iVar1 = tcp_read(this->_s,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
  sVar2 = CONCAT44(extraout_var,iVar1);
  if (iVar1 == 0) {
    piVar3 = __errno_location();
    *piVar3 = 0x20;
    sVar2 = -1;
  }
  return sVar2;
}

Assistant:

int zmq::stream_engine_base_t::read (void *data_, size_t size_)
{
    const int rc = zmq::tcp_read (_s, data_, size_);

    if (rc == 0) {
        // connection closed by peer
        errno = EPIPE;
        return -1;
    }

    return rc;
}